

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  int iVar1;
  Extension *pEVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_> *value;
  MessageLite *this_00;
  Descriptor *pDVar3;
  undefined4 extraout_var;
  
  pEVar2 = MaybeNewRepeatedExtension(this,descriptor);
  value = RepeatedPtrFieldBase::
          AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                    ((RepeatedPtrFieldBase *)pEVar2->field_0);
  if (value == (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_>
                *)0x0) {
    if (((RepeatedPtrFieldBase *)(pEVar2->field_0).int64_t_value)->current_size_ == 0) {
      pDVar3 = FieldDescriptor::message_type(descriptor);
      iVar1 = (*factory->_vptr_MessageFactory[2])(factory,pDVar3);
      this_00 = (MessageLite *)CONCAT44(extraout_var,iVar1);
      if (this_00 == (MessageLite *)0x0) {
        AddMessage((ExtensionSet *)&stack0xffffffffffffffc8);
      }
    }
    else {
      this_00 = RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                          ((RepeatedPtrFieldBase *)(pEVar2->field_0).int64_t_value,0);
    }
    value = MessageLite::New(this_00,this->arena_);
    RepeatedPtrFieldBase::
    AddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
              ((RepeatedPtrFieldBase *)pEVar2->field_0,value);
  }
  return value;
}

Assistant:

MessageLite* ExtensionSet::AddMessage(const FieldDescriptor* descriptor,
                                      MessageFactory* factory) {
  Extension* extension = MaybeNewRepeatedExtension(descriptor);

  // RepeatedPtrField<Message> does not know how to Add() since it cannot
  // allocate an abstract object, so we have to be tricky.
  MessageLite* result =
      reinterpret_cast<internal::RepeatedPtrFieldBase*>(
          extension->ptr.repeated_message_value)
          ->AddFromCleared<GenericTypeHandler<MessageLite> >();
  if (result == nullptr) {
    const MessageLite* prototype;
    if (extension->ptr.repeated_message_value->empty()) {
      prototype = factory->GetPrototype(descriptor->message_type());
      ABSL_CHECK(prototype != nullptr);
    } else {
      prototype = &extension->ptr.repeated_message_value->Get(0);
    }
    result = prototype->New(arena_);
    extension->ptr.repeated_message_value->AddAllocated(result);
  }
  return result;
}